

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cpp
# Opt level: O0

void __thiscall jsonnet::internal::CompilerPass::visit(CompilerPass *this,DesugaredObject *ast)

{
  bool bVar1;
  reference ppAVar2;
  long in_RSI;
  list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_> *in_RDI;
  Field *field;
  iterator __end2_1;
  iterator __begin2_1;
  Fields *__range2_1;
  AST *assert;
  iterator __end2;
  iterator __begin2;
  ASTs *__range2;
  reference in_stack_ffffffffffffffb0;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  local_40;
  long local_38;
  AST *local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  long local_10;
  
  local_18 = in_RSI + 0x80;
  local_10 = in_RSI;
  local_20._M_node =
       (_List_node_base *)
       std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::
       begin(in_RDI);
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>::end
                 (in_RDI);
  while( true ) {
    bVar1 = std::operator!=(&local_20,&local_28);
    if (!bVar1) break;
    ppAVar2 = std::_List_iterator<jsonnet::internal::AST_*>::operator*
                        ((_List_iterator<jsonnet::internal::AST_*> *)in_stack_ffffffffffffffb0);
    local_30 = *ppAVar2;
    (*(code *)(in_RDI->
              super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>)
              ._M_impl._M_node.super__List_node_base._M_next[3]._M_next)(in_RDI,&local_30);
    std::_List_iterator<jsonnet::internal::AST_*>::operator++(&local_20);
  }
  local_38 = local_10 + 0x98;
  local_40._M_current =
       (Field *)std::
                vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                ::begin((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
                         *)in_RDI);
  std::
  vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
  ::end((vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
         *)in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                        *)in_stack_ffffffffffffffb0,
                       (__normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffb0 =
         __gnu_cxx::
         __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
         ::operator*(&local_40);
    (*(code *)(in_RDI->
              super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>)
              ._M_impl._M_node.super__List_node_base._M_next[3]._M_next)
              (in_RDI,&in_stack_ffffffffffffffb0->name);
    (*(code *)(in_RDI->
              super__List_base<jsonnet::internal::AST_*,_std::allocator<jsonnet::internal::AST_*>_>)
              ._M_impl._M_node.super__List_node_base._M_next[3]._M_next)
              (in_RDI,&in_stack_ffffffffffffffb0->body);
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
    ::operator++(&local_40);
  }
  return;
}

Assistant:

void CompilerPass::visit(DesugaredObject *ast)
{
    for (AST *assert : ast->asserts) {
        expr(assert);
    }
    for (auto &field : ast->fields) {
        expr(field.name);
        expr(field.body);
    }
}